

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AZHighLevelEncoder.cpp
# Opt level: O2

BitArray * ZXing::Aztec::HighLevelEncoder::Encode(BitArray *__return_storage_ptr__,string *text)

{
  char cVar1;
  pointer pcVar2;
  pointer pTVar3;
  char cVar4;
  bool bVar5;
  int index;
  ulong uVar6;
  int iVar7;
  _List_node_base *p_Var8;
  long lVar9;
  Token *symbol;
  pointer this;
  _List_node_base *p_Var10;
  ulong uVar11;
  ulong uVar12;
  int mode;
  ulong uVar13;
  _List_base<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_> local_108;
  EncodingState minState;
  list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_> states;
  EncodingState local_a0;
  EncodingState stateNoBinary;
  _List_base<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_> local_48;
  
  states.super__List_base<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&states;
  states.super__List_base<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>
  ._M_impl._M_node._M_size = 0;
  stateNoBinary.tokens.super__Vector_base<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  stateNoBinary.mode = 0;
  stateNoBinary.binaryShiftByteCount = 0;
  stateNoBinary.tokens.super__Vector_base<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  stateNoBinary.tokens.super__Vector_base<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  stateNoBinary.bitCount = 0;
  states.super__List_base<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       states.
       super__List_base<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>.
       _M_impl._M_node.super__List_node_base._M_next;
  std::__cxx11::list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>::
  push_back((list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_> *)
            states.
            super__List_base<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>
            ._M_impl._M_node.super__List_node_base._M_next,&stateNoBinary);
  std::_Vector_base<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>::~_Vector_base
            ((_Vector_base<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_> *)
             &stateNoBinary);
  uVar6 = 0;
  do {
    while( true ) {
      iVar7 = (int)text->_M_string_length;
      index = (int)uVar6;
      if (iVar7 <= index) {
        p_Var8 = states.
                 super__List_base<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>
                 ._M_impl._M_node.super__List_node_base._M_next;
        p_Var10 = states.
                  super__List_base<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>
                  ._M_impl._M_node.super__List_node_base._M_next;
        if (states.
            super__List_base<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>
            ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&states) {
          while (p_Var10 = (((_List_base<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>
                              *)&p_Var10->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
                p_Var10 != (_List_node_base *)&states) {
            if (*(int *)&p_Var10[3]._M_next < *(int *)&p_Var8[3]._M_next) {
              p_Var8 = p_Var10;
            }
          }
        }
        EncodingState::EncodingState(&minState,(EncodingState *)(p_Var8 + 1));
        EndBinaryShift(&stateNoBinary,&minState,(int)text->_M_string_length);
        pTVar3 = stateNoBinary.tokens.
                 super__Vector_base<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        (__return_storage_ptr__->_bits).
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (__return_storage_ptr__->_bits).
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (__return_storage_ptr__->_bits).
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        for (this = stateNoBinary.tokens.
                    super__Vector_base<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>.
                    _M_impl.super__Vector_impl_data._M_start; this != pTVar3; this = this + 1) {
          Token::appendTo(this,__return_storage_ptr__,text);
        }
        std::_Vector_base<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>::~_Vector_base
                  ((_Vector_base<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_> *)
                   &stateNoBinary);
        std::_Vector_base<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>::~_Vector_base
                  ((_Vector_base<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_> *)
                   &minState);
        std::__cxx11::
        _List_base<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>::
        _M_clear(&states.
                  super__List_base<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>
                );
        return __return_storage_ptr__;
      }
      lVar9 = (long)index;
      uVar6 = lVar9 + 1;
      cVar4 = '\0';
      pcVar2 = (text->_M_dataplus)._M_p;
      if ((int)uVar6 < iVar7) {
        cVar4 = pcVar2[uVar6];
      }
      cVar1 = pcVar2[lVar9];
      if (cVar1 == ':') break;
      if (cVar1 == ',') {
        iVar7 = 4;
        goto LAB_0016150a;
      }
      if (cVar1 == '.') {
        iVar7 = 3;
        goto LAB_0016150a;
      }
      if ((cVar1 == '\r') && (iVar7 = 2, cVar4 == '\n')) goto LAB_00161514;
LAB_001612ae:
      local_a0.tokens.super__Vector_base<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)&local_a0;
      local_a0.tokens.super__Vector_base<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)&local_a0;
      local_a0.tokens.super__Vector_base<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      p_Var10 = (_List_node_base *)&states;
      while( true ) {
        p_Var10 = (((_List_base<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>
                     *)&p_Var10->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
        if (p_Var10 == (_List_node_base *)&states) break;
        uVar11 = (ulong)(byte)(text->_M_dataplus)._M_p[lVar9];
        cVar4 = *(char *)(uVar11 + (long)*(int *)&p_Var10[2]._M_prev * 0x100 + CHAR_MAP);
        stateNoBinary.tokens.
        super__Vector_base<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        stateNoBinary.mode = 0;
        stateNoBinary.binaryShiftByteCount = 0;
        stateNoBinary.bitCount = 0;
        stateNoBinary.tokens.
        super__Vector_base<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        stateNoBinary.tokens.
        super__Vector_base<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        bVar5 = true;
        uVar12 = uVar11;
        for (uVar13 = 0; uVar13 != 5; uVar13 = uVar13 + 1) {
          cVar1 = *(char *)(CHAR_MAP + uVar12);
          if ('\0' < cVar1) {
            if (bVar5) {
              EndBinaryShift(&minState,(EncodingState *)(p_Var10 + 1),index);
              EncodingState::operator=(&stateNoBinary,&minState);
              std::_Vector_base<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>::
              ~_Vector_base((_Vector_base<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>
                             *)&minState);
            }
            if (((cVar4 < '\x01') || (uVar13 == 2)) || (uVar13 == *(uint *)&p_Var10[2]._M_prev)) {
              LatchAndAppend(&minState,&stateNoBinary,(int)uVar13,(int)cVar1);
              std::__cxx11::
              list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>::
              push_back((list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>
                         *)&local_a0,&minState);
              std::_Vector_base<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>::
              ~_Vector_base((_Vector_base<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>
                             *)&minState);
              if ((cVar4 < '\x01') &&
                 (-1 < *(char *)(uVar13 + (long)*(int *)&p_Var10[2]._M_prev * 6 + SHIFT_TABLE))) {
                ShiftAndAppend(&minState,&stateNoBinary,(int)uVar13,(int)cVar1);
                std::__cxx11::
                list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>::
                push_back((list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>
                           *)&local_a0,&minState);
                std::_Vector_base<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>::
                ~_Vector_base((_Vector_base<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>
                               *)&minState);
              }
            }
            bVar5 = false;
          }
          uVar12 = uVar12 + 0x100;
        }
        if ((0 < *(int *)((long)&p_Var10[2]._M_prev + 4)) ||
           (*(char *)(uVar11 + (long)*(int *)&p_Var10[2]._M_prev * 0x100 + CHAR_MAP) == '\0')) {
          AddBinaryShiftChar(&minState,(EncodingState *)(p_Var10 + 1),index);
          std::__cxx11::
          list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>::push_back
                    ((list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>
                      *)&local_a0,&minState);
          std::_Vector_base<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>::
          ~_Vector_base((_Vector_base<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_> *)
                        &minState);
        }
        std::_Vector_base<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>::~_Vector_base
                  ((_Vector_base<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_> *)
                   &stateNoBinary);
      }
      if (local_a0.tokens.
          super__Vector_base<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage < (pointer)0x2) {
        std::__cxx11::
        list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>::list
                  ((list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>
                    *)&local_108,
                   (list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>
                    *)&local_a0);
      }
      else {
        SimplifyStates((list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>
                        *)&local_108,
                       (list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>
                        *)&local_a0);
      }
      std::__cxx11::
      _List_base<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>::
      _M_clear((_List_base<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>
                *)&local_a0);
      std::__cxx11::list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>
      ::_M_move_assign(&states,&local_108);
      std::__cxx11::
      _List_base<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>::
      _M_clear(&local_108);
    }
    iVar7 = 5;
LAB_0016150a:
    if (cVar4 != ' ') goto LAB_001612ae;
LAB_00161514:
    local_108._M_impl._M_node._M_size = 0;
    p_Var10 = (_List_node_base *)&states;
    local_108._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_108;
    local_108._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_108;
    while (p_Var10 = (((_List_base<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>
                        *)&p_Var10->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var10 != (_List_node_base *)&states) {
      EndBinaryShift(&stateNoBinary,(EncodingState *)(p_Var10 + 1),index);
      LatchAndAppend(&minState,&stateNoBinary,4,iVar7);
      std::__cxx11::list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>
      ::push_back((list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_> *
                  )&local_108,&minState);
      std::_Vector_base<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>::~_Vector_base
                ((_Vector_base<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_> *)
                 &minState);
      if (*(int *)&p_Var10[2]._M_prev != 4) {
        ShiftAndAppend(&minState,&stateNoBinary,4,iVar7);
        std::__cxx11::
        list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>::push_back
                  ((list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>
                    *)&local_108,&minState);
        std::_Vector_base<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>::~_Vector_base
                  ((_Vector_base<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_> *)
                   &minState);
      }
      if (iVar7 - 3U < 2) {
        LatchAndAppend(&minState,&stateNoBinary,2,0x10 - iVar7);
        LatchAndAppend(&local_a0,&minState,2,1);
        std::__cxx11::
        list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>::push_back
                  ((list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>
                    *)&local_108,&local_a0);
        std::_Vector_base<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>::~_Vector_base
                  ((_Vector_base<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_> *)
                   &local_a0);
        std::_Vector_base<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>::~_Vector_base
                  ((_Vector_base<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_> *)
                   &minState);
      }
      if (0 < *(int *)((long)&p_Var10[2]._M_prev + 4)) {
        AddBinaryShiftChar(&local_a0,(EncodingState *)(p_Var10 + 1),index);
        AddBinaryShiftChar(&minState,&local_a0,(int)uVar6);
        std::__cxx11::
        list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>::push_back
                  ((list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>
                    *)&local_108,&minState);
        std::_Vector_base<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>::~_Vector_base
                  ((_Vector_base<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_> *)
                   &minState);
        std::_Vector_base<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>::~_Vector_base
                  ((_Vector_base<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_> *)
                   &local_a0);
      }
      std::_Vector_base<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>::~_Vector_base
                ((_Vector_base<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_> *)
                 &stateNoBinary);
    }
    SimplifyStates((list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>
                    *)&local_48,
                   (list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>
                    *)&local_108);
    std::__cxx11::
    _List_base<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>::_M_clear
              (&local_108);
    std::__cxx11::list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>::
    _M_move_assign(&states,&local_48);
    std::__cxx11::
    _List_base<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>::_M_clear
              (&local_48);
    uVar6 = (ulong)(index + 2);
  } while( true );
}

Assistant:

BitArray
HighLevelEncoder::Encode(const std::string& text)
{
	std::list<EncodingState> states;
	states.push_back(EncodingState{ std::vector<Token>(), MODE_UPPER, 0, 0 });
	for (int index = 0; index < Size(text); index++) {
		int pairCode;
		int nextChar = index + 1 < Size(text) ? text[index + 1] : 0;
		switch (text[index]) {
		case '\r': pairCode = nextChar == '\n' ? 2 : 0; break;
		case '.': pairCode = nextChar == ' ' ? 3 : 0; break;
		case ',': pairCode = nextChar == ' ' ? 4 : 0; break;
		case ':': pairCode = nextChar == ' ' ? 5 : 0; break;
		default: pairCode = 0;
		}
		if (pairCode > 0) {
			// We have one of the four special PUNCT pairs.  Treat them specially.
			// Get a new set of states for the two new characters.
			states = UpdateStateListForPair(states, index, pairCode);
			index++;
		} else {
			// Get a new set of states for the new character.
			states = UpdateStateListForChar(states, text, index);
		}
	}
	// We are left with a set of states.  Find the shortest one.
	EncodingState minState = *std::min_element(states.begin(), states.end(), [](const EncodingState& a, const EncodingState& b) { return a.bitCount < b.bitCount; });
	// Convert it to a bit array, and return.
	return ToBitArray(minState, text);
}